

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

bool __thiscall OpenMD::FragmentStamp::addNodesStamp(FragmentStamp *this,NodesStamp *nodes)

{
  NodesStamp *local_8;
  
  local_8 = nodes;
  std::vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>::push_back
            (&this->nodesStamps_,&local_8);
  return true;
}

Assistant:

bool FragmentStamp::addNodesStamp(NodesStamp* nodes) {
    nodesStamps_.push_back(nodes);
    return true;
  }